

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fy-atom.c
# Opt level: O0

int fy_atom_iter_utf8_quoted_get(fy_atom_iter *iter,size_t *lenp,uint8_t *buf)

{
  uint uVar1;
  int local_3c;
  int local_38;
  int ww;
  int w;
  int c;
  ssize_t nread;
  uint8_t *buf_local;
  size_t *lenp_local;
  fy_atom_iter *iter_local;
  
  if ((((iter == (fy_atom_iter *)0x0) || (lenp == (size_t *)0x0)) || (buf == (uint8_t *)0x0)) ||
     (*lenp < 4)) {
    iter_local._4_4_ = 0xffffffff;
  }
  else if (iter->unget_c == -1) {
    nread = (ssize_t)buf;
    buf_local = (uint8_t *)lenp;
    lenp_local = (size_t *)iter;
    _w = fy_atom_iter_read(iter,buf,1);
    if (_w == 1) {
      local_38 = fy_utf8_width_by_first_octet(*(uint8_t *)nread);
      if (local_38 == 0) {
        buf_local[0] = '\x01';
        buf_local[1] = '\0';
        buf_local[2] = '\0';
        buf_local[3] = '\0';
        buf_local[4] = '\0';
        buf_local[5] = '\0';
        buf_local[6] = '\0';
        buf_local[7] = '\0';
        iter_local._4_4_ = 0;
      }
      else if ((local_38 < 2) ||
              (_w = fy_atom_iter_read((fy_atom_iter *)lenp_local,(void *)(nread + 1),
                                      (long)(local_38 + -1)), _w == local_38 + -1)) {
        iter_local._4_4_ = fy_utf8_get((void *)nread,local_38,&local_3c);
        if ((int)iter_local._4_4_ < 0) {
          *(long *)buf_local = (long)local_38;
          iter_local._4_4_ = 0;
        }
        else {
          buf_local[0] = '\0';
          buf_local[1] = '\0';
          buf_local[2] = '\0';
          buf_local[3] = '\0';
          buf_local[4] = '\0';
          buf_local[5] = '\0';
          buf_local[6] = '\0';
          buf_local[7] = '\0';
        }
      }
      else {
        if ((_w != -1) && (_w < local_38 + -1)) {
          *(ssize_t *)buf_local = _w + *(long *)buf_local;
        }
        iter_local._4_4_ = 0;
      }
    }
    else {
      iter_local._4_4_ = 0xffffffff;
    }
  }
  else {
    uVar1 = iter->unget_c;
    iter->unget_c = -1;
    *lenp = 0;
    iter_local._4_4_ = uVar1 & 0xff;
  }
  return iter_local._4_4_;
}

Assistant:

int fy_atom_iter_utf8_quoted_get(struct fy_atom_iter *iter, size_t *lenp, uint8_t *buf) {
    ssize_t nread;
    int c, w, ww;

    if (!iter || !lenp || !buf || *lenp < 4)
        return -1;

    /* first try the pushed ungetc */
    if (iter->unget_c != -1) {
        c = iter->unget_c;
        iter->unget_c = -1;
        *lenp = 0;
        return c & 0xff;
    }

    /* read first octet */
    nread = fy_atom_iter_read(iter, &buf[0], 1);
    if (nread != 1)
        return -1;

    /* get width from it (0 means illegal) - return it and mark it */
    w = fy_utf8_width_by_first_octet(buf[0]);
    if (!w) {
        *lenp = 1;
        return 0;
    }

    /* read the rest octets (if possible) */
    if (w > 1) {
        nread = fy_atom_iter_read(iter, buf + 1, w - 1);
        if (nread != (w - 1)) {
            if (nread != -1 && nread < (w - 1))
                *lenp += nread;
            return 0;
        }
    }

    /* and return the decoded utf8 character */
    c = fy_utf8_get(buf, w, &ww);
    if (c >= 0) {
        *lenp = 0;
        return c;
    }
    *lenp = w;
    return 0;
}